

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O3

int lws_add_http_header_by_token
              (lws *wsi,lws_token_indexes token,uchar *value,int length,uchar **p,uchar *end)

{
  int iVar1;
  uchar *name;
  
  if ((((*(ulong *)&wsi->field_0x46e & 0x800000000000006) == 0) && (wsi->role_ops != &role_ops_h2))
     && ((wsi->wsistate & 0xf000000) != 0x1000000)) {
    if (_WSI_TOKEN_CLIENT_SENT_PROTOCOLS < token) {
      return 1;
    }
    iVar1 = lws_add_http_header_by_name(wsi,(uchar *)set[token],value,length,p,end);
    return iVar1;
  }
  name = lws_token_to_string(token);
  if (name != (uchar *)0x0) {
    iVar1 = lws_add_http2_header_by_name(wsi,name,value,length,p,end);
    return iVar1;
  }
  return 1;
}

Assistant:

int
lws_add_http_header_by_token(struct lws *wsi, enum lws_token_indexes token,
			     const unsigned char *value, int length,
			     unsigned char **p, unsigned char *end)
{
	const unsigned char *name;
#ifdef LWS_WITH_HTTP2
	if (lws_wsi_is_h2(wsi))
		return lws_add_http2_header_by_token(wsi, token, value,
						     length, p, end);
#endif
	name = lws_token_to_string(token);
	if (!name)
		return 1;

	return lws_add_http_header_by_name(wsi, name, value, length, p, end);
}